

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  uv__queue *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  int iVar7;
  size_t sVar8;
  long *plVar9;
  int *piVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  long lVar13;
  void **ppvVar14;
  long *plVar15;
  long *plVar16;
  long *plVar17;
  long *plVar18;
  void **ppvVar19;
  
  iVar7 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    iVar7 = 0;
    if (loop->inotify_fd == -1) {
      iVar7 = inotify_init1(0x80800);
      if (iVar7 < 0) {
        piVar10 = __errno_location();
        iVar7 = -*piVar10;
      }
      else {
        loop->inotify_fd = iVar7;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar7);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
        iVar7 = 0;
      }
    }
    if (iVar7 == 0) {
      iVar7 = inotify_add_watch(loop->inotify_fd,path,0xfc6);
      if (iVar7 == -1) {
        piVar10 = __errno_location();
        iVar7 = -*piVar10;
      }
      else {
        for (plVar9 = (long *)loop->inotify_watchers; plVar9 != (long *)0x0;
            plVar9 = (long *)*plVar9) {
          if ((int)plVar9[8] <= iVar7) {
            if (iVar7 <= (int)plVar9[8]) goto LAB_0011de45;
            plVar9 = plVar9 + 1;
          }
        }
        plVar9 = (long *)0x0;
LAB_0011de45:
        if (plVar9 == (long *)0x0) {
          sVar8 = strlen(path);
          plVar9 = (long *)uv__malloc(sVar8 + 0x49);
          if (plVar9 == (long *)0x0) {
            return -0xc;
          }
          ppvVar19 = &loop->inotify_watchers;
          *(int *)(plVar9 + 8) = iVar7;
          memcpy(plVar9 + 9,path,sVar8 + 1);
          plVar9[7] = (long)(plVar9 + 9);
          plVar9[4] = (long)(plVar9 + 4);
          plVar9[5] = (long)(plVar9 + 4);
          *(undefined4 *)(plVar9 + 6) = 0;
          puVar6 = (undefined8 *)*ppvVar19;
          if ((undefined8 *)*ppvVar19 == (undefined8 *)0x0) {
            lVar13 = 8;
            puVar11 = (undefined8 *)0x0;
          }
          else {
            do {
              puVar11 = puVar6;
              iVar2 = *(int *)(puVar11 + 8);
              puVar12 = puVar11;
              if (iVar2 <= iVar7) {
                if (iVar7 <= iVar2) goto LAB_0011e0ec;
                puVar12 = puVar11 + 1;
              }
              puVar6 = (undefined8 *)*puVar12;
            } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
            lVar13 = (ulong)(iVar2 <= iVar7) << 3;
          }
          plVar9[2] = (long)puVar11;
          *plVar9 = 0;
          plVar9[1] = 0;
          ppvVar14 = (void **)(lVar13 + (long)puVar11);
          if (puVar11 == (undefined8 *)0x0) {
            ppvVar14 = ppvVar19;
          }
          *(undefined4 *)(plVar9 + 3) = 1;
          *ppvVar14 = plVar9;
          plVar17 = (long *)plVar9[2];
          plVar5 = plVar9;
          while ((plVar17 != (long *)0x0 && ((int)plVar17[3] == 1))) {
            plVar16 = (long *)plVar17[2];
            plVar18 = (long *)*plVar16;
            plVar15 = plVar5;
            if (plVar17 == plVar18) {
              plVar18 = (long *)plVar16[1];
              if ((plVar18 == (long *)0x0) || ((int)plVar18[3] != 1)) {
                plVar18 = (long *)plVar17[1];
                if (plVar18 == plVar5) {
                  lVar13 = *plVar18;
                  plVar17[1] = lVar13;
                  if (lVar13 != 0) {
                    *(long **)(*plVar18 + 0x10) = plVar17;
                  }
                  lVar13 = plVar17[2];
                  plVar18[2] = lVar13;
                  ppvVar14 = ppvVar19;
                  if (lVar13 != 0) {
                    ppvVar14 = (void **)((undefined8 *)plVar17[2] +
                                        (plVar17 != *(long **)plVar17[2]));
                  }
                  *ppvVar14 = plVar18;
                  *plVar18 = (long)plVar17;
                  plVar17[2] = (long)plVar18;
                  plVar15 = plVar17;
                  plVar17 = plVar5;
                }
                *(undefined4 *)(plVar17 + 3) = 0;
                *(undefined4 *)(plVar16 + 3) = 1;
                plVar17 = (long *)*plVar16;
                lVar13 = plVar17[1];
                *plVar16 = lVar13;
                if (lVar13 != 0) {
                  *(long **)(plVar17[1] + 0x10) = plVar16;
                }
                lVar13 = plVar16[2];
                plVar17[2] = lVar13;
                ppvVar14 = ppvVar19;
                if (lVar13 != 0) {
                  ppvVar14 = (void **)((undefined8 *)plVar16[2] + (plVar16 != *(long **)plVar16[2]))
                  ;
                }
                *ppvVar14 = plVar17;
                plVar17[1] = (long)plVar16;
                goto LAB_0011e0ce;
              }
LAB_0011df7b:
              *(undefined4 *)(plVar18 + 3) = 0;
              *(undefined4 *)(plVar17 + 3) = 0;
              *(undefined4 *)(plVar16 + 3) = 1;
            }
            else {
              if ((plVar18 != (long *)0x0) && ((int)plVar18[3] == 1)) goto LAB_0011df7b;
              plVar18 = (long *)*plVar17;
              if (plVar18 == plVar5) {
                lVar13 = plVar18[1];
                *plVar17 = lVar13;
                if (lVar13 != 0) {
                  *(long **)(plVar18[1] + 0x10) = plVar17;
                }
                lVar13 = plVar17[2];
                plVar18[2] = lVar13;
                ppvVar14 = ppvVar19;
                if (lVar13 != 0) {
                  ppvVar14 = (void **)((undefined8 *)plVar17[2] + (plVar17 != *(long **)plVar17[2]))
                  ;
                }
                *ppvVar14 = plVar18;
                plVar18[1] = (long)plVar17;
                plVar17[2] = (long)plVar18;
                plVar15 = plVar17;
                plVar17 = plVar5;
              }
              *(undefined4 *)(plVar17 + 3) = 0;
              *(undefined4 *)(plVar16 + 3) = 1;
              plVar17 = (long *)plVar16[1];
              lVar13 = *plVar17;
              plVar16[1] = lVar13;
              if (lVar13 != 0) {
                *(long **)(*plVar17 + 0x10) = plVar16;
              }
              lVar13 = plVar16[2];
              plVar17[2] = lVar13;
              ppvVar14 = ppvVar19;
              if (lVar13 != 0) {
                ppvVar14 = (void **)((undefined8 *)plVar16[2] + (plVar16 != *(long **)plVar16[2]));
              }
              *ppvVar14 = plVar17;
              *plVar17 = (long)plVar16;
LAB_0011e0ce:
              plVar16[2] = (long)plVar17;
              plVar16 = plVar15;
            }
            plVar5 = plVar16;
            plVar17 = (long *)plVar16[2];
          }
          *(undefined4 *)((long)*ppvVar19 + 0x18) = 0;
        }
LAB_0011e0ec:
        uVar3 = handle->flags;
        if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        (handle->watchers).next = (uv__queue *)(plVar9 + 4);
        puVar4 = (uv__queue *)plVar9[5];
        (handle->watchers).prev = puVar4;
        puVar4->next = &handle->watchers;
        plVar9[5] = (long)&handle->watchers;
        handle->path = (char *)plVar9[7];
        handle->cb = cb;
        handle->wd = iVar7;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  uv_loop_t* loop;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  loop = handle->loop;

  err = init_inotify(loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  uv__queue_init(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, uv__inotify_watchers(loop), w);

no_insert:
  uv__handle_start(handle);
  uv__queue_insert_tail(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}